

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O2

void __thiscall OpenMD::DataHolder::assign<int>(DataHolder *this,string *keyword,int val)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  ostream *poVar4;
  OpenMDException *pOVar5;
  int val_local;
  string local_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->deprecatedKeywords_)._M_t,keyword);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",
               (keyword->_M_dataplus)._M_p);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_198,(string *)keyword);
    std::operator<<(poVar4," is not a recognized keyword.\n");
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1c8);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  cVar1 = (**(code **)(**(long **)(iVar2._M_node + 2) + 0x20))(*(long **)(iVar2._M_node + 2),val);
  if (cVar1 != '\0') {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_198,"Error in parsing ");
  poVar4 = std::operator<<(poVar4,(string *)keyword);
  poVar4 = std::operator<<(poVar4,": expected ");
  (**(code **)(**(long **)(iVar2._M_node + 2) + 0x48))(&local_1c8);
  poVar4 = std::operator<<(poVar4,(string *)&local_1c8);
  poVar4 = std::operator<<(poVar4," but got ");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar5,&local_1c8);
  __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }